

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall udpdiscovery::impl::PeerEnv::~PeerEnv(PeerEnv *this)

{
  pointer pcVar1;
  
  (this->super_PeerEnvInterface)._vptr_PeerEnvInterface = (_func_int **)&PTR__PeerEnv_0010ad10;
  if (this->binding_sock_ != -1) {
    close(this->binding_sock_);
  }
  if (this->sock_ != -1) {
    close(this->sock_);
  }
  std::__cxx11::
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_clear
            (&(this->discovered_peers_).
              super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
            );
  pcVar1 = (this->user_data_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->user_data_).field_2) {
    operator_delete(pcVar1);
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->lock_);
  return;
}

Assistant:

~PeerEnv() {
    if (binding_sock_ != kInvalidSocket) {
      CloseSocket(binding_sock_);
    }

    if (sock_ != kInvalidSocket) {
      CloseSocket(sock_);
    }
  }